

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen9Resource_Test2DTileYsResource_Test::TestBody
          (CTestGen9Resource_Test2DTileYsResource_Test *this)

{
  uint uVar1;
  uint32_t uVar2;
  GMM_RESOURCE_INFO *pGVar3;
  GMM_RESOURCE_INFO *ResourceInfo_2;
  TEST_BPP bpp_2;
  uint32_t i_2;
  GMM_RESOURCE_INFO *ResourceInfo_1;
  TEST_BPP bpp_1;
  uint32_t i_1;
  GMM_RESOURCE_INFO *ResourceInfo;
  TEST_BPP bpp;
  uint32_t i;
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t TileSize [5] [2];
  uint32_t VAlign [5];
  uint32_t HAlign [5];
  CTestGen9Resource_Test2DTileYsResource_Test *this_local;
  
  HAlign[0] = 0x80;
  HAlign[1] = 0x80;
  HAlign[2] = 0x40;
  VAlign[0] = 0x80;
  VAlign[1] = 0x40;
  VAlign[2] = 0x40;
  unique0x10000532 = this;
  memcpy(&gmmParams.MultiTileArch,&DAT_0022b790,0x28);
  memset(&bpp,0,0x80);
  bpp = TEST_BPP_32;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams.Flags.Gpu =
       (anon_struct_8_45_9b07292e_for_Gpu)
       ((ulong)gmmParams.Flags.Gpu & 0xffffffafffffffff | 0x5000000000);
  gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbffffffff | 0x400000000;
  for (ResourceInfo._4_4_ = TEST_BPP_8; ResourceInfo._4_4_ < TEST_BPP_MAX;
      ResourceInfo._4_4_ = ResourceInfo._4_4_ + TEST_BPP_16) {
    i = CTestResource::SetResourceFormat((CTestResource *)this,ResourceInfo._4_4_);
    gmmParams.CpTag = 1;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 1;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&bpp);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar3,HAlign[(ulong)ResourceInfo._4_4_ - 2]);
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar3,VAlign[(ulong)ResourceInfo._4_4_ - 2]);
    CTestResource::VerifyResourcePitch<true>
              ((CTestResource *)this,pGVar3,TileSize[(ulong)ResourceInfo._4_4_ - 1][0]);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,1);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar3,0x10000);
    CTestResource::VerifyResourceQPitch<false>((CTestResource *)this,pGVar3,0);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
  }
  for (ResourceInfo_1._4_4_ = TEST_BPP_8; ResourceInfo_1._4_4_ < TEST_BPP_MAX;
      ResourceInfo_1._4_4_ = ResourceInfo_1._4_4_ + TEST_BPP_16) {
    i = CTestResource::SetResourceFormat((CTestResource *)this,ResourceInfo_1._4_4_);
    uVar1 = TileSize[(ulong)ResourceInfo_1._4_4_ - 1][0];
    uVar2 = CTestResource::GetBppValue((CTestResource *)this,ResourceInfo_1._4_4_);
    gmmParams._40_8_ = ZEXT48(uVar1 / uVar2 + 1);
    gmmParams.field_6.BaseWidth = 1;
    gmmParams.field_6.BaseWidth64._4_4_ = 1;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&bpp,(ulong)uVar1 % (ulong)uVar2);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar3,HAlign[(ulong)ResourceInfo_1._4_4_ - 2]);
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar3,VAlign[(ulong)ResourceInfo_1._4_4_ - 2]);
    CTestResource::VerifyResourcePitch<true>
              ((CTestResource *)this,pGVar3,TileSize[(ulong)ResourceInfo_1._4_4_ - 1][0] << 1);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar3,0x20000);
    CTestResource::VerifyResourceQPitch<false>((CTestResource *)this,pGVar3,0);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
  }
  for (ResourceInfo_2._4_4_ = TEST_BPP_8; ResourceInfo_2._4_4_ < TEST_BPP_MAX;
      ResourceInfo_2._4_4_ = ResourceInfo_2._4_4_ + TEST_BPP_16) {
    i = CTestResource::SetResourceFormat((CTestResource *)this,ResourceInfo_2._4_4_);
    uVar1 = TileSize[(ulong)ResourceInfo_2._4_4_ - 1][0];
    uVar2 = CTestResource::GetBppValue((CTestResource *)this,ResourceInfo_2._4_4_);
    gmmParams._40_8_ = ZEXT48(uVar1 / uVar2 + 1);
    gmmParams.field_6.BaseWidth = TileSize[(ulong)ResourceInfo_2._4_4_ - 1][1] + 1;
    gmmParams.field_6.BaseWidth64._4_4_ = 1;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&bpp,(ulong)uVar1 % (ulong)uVar2);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar3,HAlign[(ulong)ResourceInfo_2._4_4_ - 2]);
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar3,VAlign[(ulong)ResourceInfo_2._4_4_ - 2]);
    CTestResource::VerifyResourcePitch<true>
              ((CTestResource *)this,pGVar3,TileSize[(ulong)ResourceInfo_2._4_4_ - 1][0] << 1);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar3,0x40000);
    CTestResource::VerifyResourceQPitch<false>((CTestResource *)this,pGVar3,0);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test2DTileYsResource)
{

    const uint32_t HAlign[TEST_BPP_MAX] = {256, 256, 128, 128, 64};
    const uint32_t VAlign[TEST_BPP_MAX] = {256, 128, 128, 64, 64};

    const uint32_t TileSize[TEST_BPP_MAX][2] = {{256, 256},
                                                {512, 128},
                                                {512, 128},
                                                {1024, 64},
                                                {1024, 64}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Info.TiledYs   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    //Allocate 1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0]); // As wide as 1 Tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);       // 1 Tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(64));   // 1 Tile Big
        VerifyResourceQPitch<false>(ResourceInfo, 0);            // Not Tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate surface that requires multi tiles in two dimension
    // Allocate 2 tiles in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(64) * 2);   // 2 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileSize[i][1] + 1;                      // 1 row larger than 1 tile height
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(64) * 4);   // 4 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}